

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<float> *original_costs,
            double cost_constant)

{
  double dVar1;
  init_policy_type iVar2;
  context *this_00;
  context *ctx;
  undefined8 uVar3;
  void *pvVar4;
  bool bVar5;
  unique_ptr<float[],_std::default_delete<float[]>_> P;
  unique_ptr<float[],_std::default_delete<float[]>_> uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  rep rVar11;
  long lVar12;
  result_status rVar13;
  random_engine *rng;
  int iVar14;
  long lVar15;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  float *in_R9;
  ulong uVar16;
  float delta;
  float fVar17;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  double dVar18;
  undefined1 auVar22 [64];
  double dVar19;
  undefined1 extraout_var_00 [60];
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  float theta;
  undefined1 auVar26 [12];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qb;
  string_view filename;
  bit_array x;
  quadratic_cost_type<float> norm_costs;
  compute_order compute;
  solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  slv;
  file_observer obs;
  bit_array_impl local_3c0;
  float local_3ac;
  double local_3a8;
  double local_3a0;
  double local_398;
  quadratic_cost_type<float> *local_390;
  double local_388;
  ulong local_380;
  int local_374;
  quadratic_cost_type<float> local_370;
  double local_350;
  compute_order local_348;
  solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  local_310;
  undefined1 local_288 [8];
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Stack_280;
  filebuf local_278 [240];
  ios_base local_188 [264];
  ap_file_observer local_80;
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [60];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  auVar22 = ZEXT1664(in_ZMM3._0_16_);
  local_388 = cost_constant;
  bit_array_impl::bit_array_impl(&local_3c0,variables);
  this_00 = this->m_ctx;
  normalize_costs<float,baryonyx::itm::quadratic_cost_type<float>>
            (&local_370,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<float> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             (int)in_R9);
  local_3a0 = (this_00->parameters).kappa_step;
  local_3a8 = (this_00->parameters).kappa_max;
  dVar19 = (this_00->parameters).alpha;
  dVar1 = (this_00->parameters).delta;
  theta = (float)(this_00->parameters).theta;
  if (0.0 <= dVar1) {
    delta = (float)dVar1;
  }
  else {
    ctx = this->m_ctx;
    local_288._0_4_ = theta;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar21._0_4_ = quadratic_cost_type<float>::min(&local_370,variables);
    auVar21._4_60_ = extraout_var;
    auVar20 = vfnmadd132ss_fma(auVar21._0_16_,auVar21._0_16_,ZEXT416((uint)local_288._0_4_));
    local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar20._0_4_;
    local_310.super_debug_logger<true>.ofs._0_4_ = auVar21._0_4_;
    info<float,float,float>
              ((baryonyx *)ctx,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n",
               (char *)&local_348,(float *)&local_310,(float *)local_288,in_R9);
    delta = local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_;
  }
  local_398 = (this_00->parameters).pushing_k_factor;
  local_350 = (this_00->parameters).pushing_objective_amplifier;
  local_380 = (ulong)(this_00->parameters).w;
  solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  ::solver_equalities_101coeff
            (&local_310,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_370,constraints);
  compute_order::compute_order(&local_348,(this_00->parameters).order,variables);
  dVar1 = (this->m_ctx->parameters).init_policy_random;
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar2 = (this_00->parameters).init_policy;
  if (iVar2 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_3c0,original_costs,variables,0);
  }
  else {
    if (iVar2 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_3c0;
      x_optimistic = (bit_array_impl *)local_288;
    }
    else {
      if (iVar2 != optimistic_solve) goto LAB_002bbae6;
      rng = this->m_rng;
      x_pessimistic = (bit_array_impl *)local_288;
      x_optimistic = &local_3c0;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_002bbae6:
  auVar26 = auVar22._4_12_;
  local_390 = original_costs;
  if (local_3c0.m_size != 0) {
    iVar14 = 0;
    do {
      dVar18 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar18 < dVar1) {
        bit_array_impl::invert(&local_3c0,iVar14);
      }
      auVar26 = auVar22._4_12_;
      iVar14 = iVar14 + 1;
    } while (local_3c0.m_size != iVar14);
  }
  if (_Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)_Stack_280._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar1 = (this_00->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer
            ((file_observer *)local_288,filename,local_310.m,local_310.n,(this_00->parameters).limit
            );
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar11;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar11;
  compute_order::
  init<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
            (&local_348,&local_310,(bit_array *)&local_3c0);
  local_3ac = (float)local_3a0;
  local_3a0 = (double)CONCAT44(local_3a0._4_4_,(float)local_3a8);
  local_3a8 = (double)CONCAT44(local_3a8._4_4_,(float)dVar19);
  auVar22 = ZEXT1664(CONCAT124(auVar26,(float)dVar1));
  local_374 = variables;
  if ((this_00->parameters).limit == 0) {
    bVar7 = false;
  }
  else {
    iVar14 = 0x7fffffff;
    lVar15 = 0;
    bVar7 = false;
    do {
      fVar24 = auVar22._0_4_;
      iVar8 = compute_order::
              run<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                        (&local_348,&local_310,(bit_array *)&local_3c0,this->m_rng,fVar24,delta,
                         theta);
      uVar6._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)local_310.pi;
      P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)local_310.P;
      details::pi_file_observer::make_observation<float>
                ((pi_file_observer *)local_288,(sparse_matrix<int> *)((long)&local_310 + 0x10),
                 (float *)local_310.P._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl,
                 (float *)local_310.pi._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      details::ap_file_observer::make_observation<float>
                (&local_80,(sparse_matrix<int> *)((long)&local_310 + 0x10),
                 (float *)P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl,
                 (float *)uVar6._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                          _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      if (iVar8 == 0) {
        dVar19 = quadratic_cost_type<float>::results(local_390,(bit_array *)&local_3c0,local_388);
        store_if_better(this,(bit_array *)&local_3c0,dVar19,lVar15);
        bVar7 = true;
        iVar14 = 0;
        bVar5 = false;
LAB_002bbcf2:
        auVar22 = ZEXT464((uint)fVar24);
      }
      else {
        if (iVar8 < iVar14) {
          store_if_better(this,(bit_array *)&local_3c0,iVar8,lVar15);
          iVar14 = iVar8;
        }
        if ((long)local_380 < lVar15) {
          auVar22._0_4_ = powf((float)iVar8 / (float)local_310.m,local_3a8._0_4_);
          auVar22._4_60_ = extraout_var_00;
          auVar20 = vfmadd231ss_fma(ZEXT416((uint)fVar24),auVar22._0_16_,ZEXT416((uint)local_3ac));
          auVar22 = ZEXT1664(auVar20);
        }
        else {
          auVar22 = ZEXT464((uint)fVar24);
        }
        rVar13 = kappa_max_reached;
        fVar24 = auVar22._0_4_;
        if (local_3a0._0_4_ < fVar24) {
LAB_002bbd63:
          __return_storage_ptr__->status = rVar13;
          bVar5 = false;
        }
        else {
          lVar12 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar12;
          dVar19 = (this->m_ctx->parameters).time_limit;
          bVar5 = true;
          if (dVar19 <= 0.0) goto LAB_002bbcf2;
          rVar13 = time_limit_reached;
          auVar22 = ZEXT464((uint)fVar24);
          if (dVar19 < (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_002bbd63;
        }
      }
    } while ((bVar5) && (lVar15 = lVar15 + 1, lVar15 != (this_00->parameters).limit));
  }
  if (bVar7) {
    if (0 < (this_00->parameters).pushes_limit) {
      fVar24 = (float)local_398;
      local_398 = (double)CONCAT44(local_398._4_4_,(float)local_350);
      iVar14 = 0;
      iVar8 = 0;
      do {
        fVar17 = auVar22._0_4_;
        iVar9 = compute_order::
                push_and_run<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                          (&local_348,&local_310,(bit_array *)&local_3c0,this->m_rng,fVar17 * fVar24
                           ,delta,theta,local_398._0_4_);
        if (iVar9 == 0) {
          dVar19 = quadratic_cost_type<float>::results(local_390,(bit_array *)&local_3c0,local_388);
          store_if_better(this,(bit_array *)&local_3c0,dVar19,
                          (long)~((this_00->parameters).pushing_iteration_limit * iVar8));
        }
        lVar15 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar15;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (this->m_ctx->parameters).time_limit;
        auVar20._0_8_ = (double)(lVar15 - (this->m_begin).__d.__r) / 1000000000.0;
        auVar20._8_8_ = in_XMM4_Qb;
        uVar3 = vcmppd_avx512vl(auVar25,ZEXT816(0),6);
        uVar16 = vcmppd_avx512vl(auVar25,auVar20,1);
        uVar16 = ((byte)uVar3 & 3) & uVar16;
        local_380 = CONCAT62(local_380._2_6_,(short)uVar16);
        if ((uVar16 & 1) == 0) {
          auVar22 = ZEXT464((uint)fVar17);
          if (0 < (this_00->parameters).pushing_iteration_limit) {
            iVar9 = 1;
            do {
              fVar17 = auVar22._0_4_;
              iVar10 = compute_order::
                       run<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                                 (&local_348,&local_310,(bit_array *)&local_3c0,this->m_rng,fVar17,
                                  delta,theta);
              if (iVar10 == 0) {
                dVar19 = quadratic_cost_type<float>::results
                                   (local_390,(bit_array *)&local_3c0,local_388);
                store_if_better(this,(bit_array *)&local_3c0,dVar19,
                                (long)((this_00->parameters).pushing_iteration_limit * iVar14 -
                                      iVar9));
                auVar22 = ZEXT464((uint)fVar17);
                break;
              }
              if ((double)(iVar9 + -1) <= (this_00->parameters).w) {
                auVar22 = ZEXT464((uint)fVar17);
              }
              else {
                auVar23._0_4_ = powf((float)iVar10 / (float)local_310.m,local_3a8._0_4_);
                auVar23._4_60_ = extraout_var_01;
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)fVar17),auVar23._0_16_,
                                          ZEXT416((uint)local_3ac));
                auVar22 = ZEXT1664(auVar20);
              }
              fVar17 = auVar22._0_4_;
              if (local_3a0._0_4_ < fVar17) break;
              lVar15 = std::chrono::_V2::steady_clock::now();
              (this->m_end).__d.__r = lVar15;
              dVar19 = (this->m_ctx->parameters).time_limit;
              if ((0.0 < dVar19) &&
                 (dVar19 < (double)(lVar15 - (this->m_begin).__d.__r) / 1000000000.0))
              goto LAB_002bbe7e;
              auVar22 = ZEXT464((uint)fVar17);
              bVar7 = iVar9 < (this_00->parameters).pushing_iteration_limit;
              iVar9 = iVar9 + 1;
            } while (bVar7);
          }
        }
        else {
LAB_002bbe7e:
          auVar22 = ZEXT464((uint)fVar17);
        }
        if ((local_380 & 1) != 0) break;
        iVar8 = iVar8 + 1;
        iVar14 = iVar14 + -1;
      } while (iVar8 < (this_00->parameters).pushes_limit);
    }
  }
  else {
    __return_storage_ptr__->status = limit_reached;
  }
  iVar14 = local_374;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar14);
  }
  if (local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_basename._M_dataplus._M_p != &local_80.m_basename.field_2) {
    operator_delete(local_80.m_basename._M_dataplus._M_p,
                    local_80.m_basename.field_2._M_allocated_capacity + 1);
  }
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_VTT;
  *(undefined8 *)(local_278 + _VTT[-3] + -8) = _log;
  std::filebuf::~filebuf(local_278);
  std::ios_base::~ios_base(local_188);
  if (local_348.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_348.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_348.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  ::~solver_equalities_101coeff(&local_310);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_370.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_370.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_370.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
       )local_370.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_370.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                              ._M_head_impl);
  }
  local_370.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
          )0x0;
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)
      local_370.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (float *)0x0) {
    operator_delete__((void *)local_370.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_3c0.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_3c0.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }